

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagesetupdialog_unix.cpp
# Opt level: O0

void __thiscall QPageSetupDialog::QPageSetupDialog(QPageSetupDialog *this,QWidget *parent)

{
  QPrinter *printer;
  QUnixPageSetupDialogPrivate *this_00;
  QWidget *in_RSI;
  EVP_PKEY_CTX *ctx;
  QDialog *in_RDI;
  long in_FS_OFFSET;
  QPageSetupDialogPrivate *d;
  QUnixPageSetupDialogPrivate *in_stack_ffffffffffffffa0;
  EVP_PKEY_CTX local_28 [28];
  uint local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  printer = (QPrinter *)operator_new(800);
  QUnixPageSetupDialogPrivate::QUnixPageSetupDialogPrivate(in_stack_ffffffffffffffa0,printer);
  local_c = 0;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x164fe5);
  QDialog::QDialog(in_RDI,(QDialogPrivate *)printer,in_RSI,(QFlags_conflict *)(ulong)local_c);
  *(undefined ***)in_RDI = &PTR_metaObject_001a9dd8;
  *(undefined ***)(in_RDI + 0x10) = &PTR__QPageSetupDialog_001a9fb0;
  this_00 = (QUnixPageSetupDialogPrivate *)d_func((QPageSetupDialog *)0x165021);
  ctx = local_28;
  QCoreApplication::translate((char *)ctx,"QPrintPreviewDialog","Page Setup",0);
  QWidget::setWindowTitle((QString *)in_RDI);
  QString::~QString((QString *)0x165067);
  QUnixPageSetupDialogPrivate::init(this_00,ctx);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QPageSetupDialog::QPageSetupDialog(QWidget *parent)
    : QDialog(*(new QUnixPageSetupDialogPrivate(nullptr)), parent)
{
    Q_D(QPageSetupDialog);
    setWindowTitle(QCoreApplication::translate("QPrintPreviewDialog", "Page Setup"));
    static_cast<QUnixPageSetupDialogPrivate *>(d)->init();
}